

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YinYang.cpp
# Opt level: O1

double __thiscall YinYang::coordinateZ(YinYang *this,int J,int K,int L,int G)

{
  double dVar1;
  double __x;
  double local_10;
  
  if (G == 1) {
    this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
    __x = (double)K * this->d_theta2 + this->theta2_lb;
    this->theta2 = __x;
    dVar1 = (this->super_Parameterization).radius;
    local_10 = sin(__x);
    local_10 = local_10 * dVar1;
    dVar1 = sin(this->theta1);
  }
  else {
    if (G != 0) goto LAB_00104deb;
    this->theta1 = (double)J * this->d_theta1 + this->theta1_lb;
    dVar1 = (double)K * this->d_theta2 + this->theta2_lb;
    this->theta2 = dVar1;
    local_10 = (this->super_Parameterization).radius;
    dVar1 = cos(dVar1);
  }
  (this->super_Parameterization).z = dVar1 * local_10;
LAB_00104deb:
  return (this->super_Parameterization).z;
}

Assistant:

double YinYang::coordinateZ(int J, int K, int L, int G) {
  switch (G) {
    case 0:  // Yin
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      z = radius * cos(theta2);
      break;
    case 1:  // Yang
      theta1 = theta1_lb + (double)J * d_theta1;
      theta2 = theta2_lb + (double)K * d_theta2;
      //z = radius * sin(theta2) * cos(theta1);
      z = radius * sin(theta2) * sin(theta1);
      break;
  }

  return z;
}